

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

function<void_(const_QtPromisePrivate::PromiseError_&)> * __thiscall
QtPromisePrivate::PromiseCatcher<float,float(*)(QString_const&),QString_const&>::
create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>
          (function<void_(const_QtPromisePrivate::PromiseError_&)> *__return_storage_ptr__,
          PromiseCatcher<float,float(*)(QString_const&),QString_const&> *this,
          _func_float_QString_ptr **handler,QPromiseResolve<float> *resolve,
          QPromiseReject<float> *reject)

{
  anon_class_24_3_a63a5800 local_20;
  
  local_20.resolve.m_resolver.m_d.d = (PromiseResolver<float>)*handler;
  if (local_20.resolve.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data>)0x0) {
    LOCK();
    (((Data *)local_20.resolve.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_20.resolve.m_resolver.m_d.d)->super_QSharedData).ref.
         super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
         _M_i + 1;
    UNLOCK();
  }
  local_20.reject.m_resolver.m_d.d = (PromiseResolver<float>)(resolve->m_resolver).m_d.d;
  if (local_20.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data>)0x0) {
    LOCK();
    (((Data *)local_20.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_20.reject.m_resolver.m_d.d)->super_QSharedData).ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_20.handler = *(_func_float_QString_ptr **)this;
  std::function<void(QtPromisePrivate::PromiseError_const&)>::
  function<QtPromisePrivate::PromiseCatcher<float,float(*)(QString_const&),QString_const&>::create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>(float(*const&)(QString_const&),QtPromise::QPromiseResolve<float>const&,QtPromise::QPromiseReject<float>const&)::_lambda(QtPromisePrivate::PromiseError_const&)_1_,void>
            ((function<void(QtPromisePrivate::PromiseError_const&)> *)__return_storage_ptr__,
             &local_20);
  if (local_20.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data>)0x0) {
    LOCK();
    (((QSharedData *)local_20.reject.m_resolver.m_d.d)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_20.reject.m_resolver.m_d.d)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)local_20.reject.m_resolver.m_d.d)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete((void *)local_20.reject.m_resolver.m_d.d,0x10);
    }
  }
  if (local_20.resolve.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data>)0x0) {
    LOCK();
    *(int *)local_20.resolve.m_resolver.m_d.d = *(int *)local_20.resolve.m_resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)local_20.resolve.m_resolver.m_d.d == 0) {
      operator_delete((void *)local_20.resolve.m_resolver.m_d.d,0x10);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::function<void(const PromiseError&)>
    create(const THandler& handler, const TResolve& resolve, const TReject& reject)
    {
        return [=](const PromiseError& error) {
            try {
                error.rethrow();
            } catch (const TArg& argError) {
                PromiseDispatch<ResType>::call(resolve, reject, handler, argError);
            } catch (...) {
                reject(std::current_exception());
            }
        };
    }